

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

FStateLabel * __thiscall FStateLabels::FindLabel(FStateLabels *this,FName *label)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  if (0 < this->NumLabels) {
    iVar2 = this->NumLabels + -1;
    iVar4 = 0;
    do {
      uVar3 = (uint)(iVar4 + iVar2) >> 1;
      iVar1 = this->Labels[uVar3].Label.Index;
      if (iVar1 == label->Index) {
        return this->Labels + uVar3;
      }
      if (iVar1 < label->Index) {
        iVar4 = uVar3 + 1;
      }
      else {
        iVar2 = uVar3 - 1;
      }
    } while (iVar4 <= iVar2);
  }
  return (FStateLabel *)0x0;
}

Assistant:

FStateLabel *FStateLabels::FindLabel (FName label)
{
	return const_cast<FStateLabel *>(BinarySearch<FStateLabel, FName>(Labels, NumLabels, &FStateLabel::Label, label));
}